

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::addFieldHandlerImpl(JsonCodec *this,Field field,Type type,HandlerBase *handler)

{
  Field key;
  bool bVar1;
  Impl *pIVar2;
  anon_class_1_0_00000001 local_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  Fault local_78;
  Fault f;
  Type *local_60;
  undefined1 local_58 [8];
  DebugComparison<capnp::Type_&,_capnp::Type> _kjCondition;
  HandlerBase *handler_local;
  JsonCodec *this_local;
  Type type_local;
  
  type_local._0_8_ = type.field_4;
  this_local = type._0_8_;
  _kjCondition._40_8_ = handler;
  local_60 = (Type *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Type *)&this_local);
  _f = StructSchema::Field::getType(&field);
  kj::_::DebugExpression<capnp::Type&>::operator==
            ((DebugComparison<capnp::Type_&,_capnp::Type> *)local_58,
             (DebugExpression<capnp::Type&> *)&local_60,(Type *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::Type&,capnp::Type>&,char_const(&)[60]>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,900,FAILED,"type == field.getType()",
               "_kjCondition,\"handler type did not match field type for addFieldHandler()\"",
               (DebugComparison<capnp::Type_&,_capnp::Type> *)local_58,
               (char (*) [60])"handler type did not match field type for addFieldHandler()");
    kj::_::Debug::Fault::fatal(&local_78);
  }
  pIVar2 = kj::Own<capnp::JsonCodec::Impl,_std::nullptr_t>::operator->(&this->impl);
  memcpy(&local_c8,&field,0x40);
  key._8_8_ = uStack_c0;
  key.parent.super_Schema.raw = (Schema)(Schema)local_c8;
  key.proto._reader.segment = (SegmentReader *)local_b8;
  key.proto._reader.capTable = (CapTableReader *)uStack_b0;
  key.proto._reader.data = (void *)local_a8;
  key.proto._reader.pointers = (WirePointer *)uStack_a0;
  key.proto._reader.dataSize = (undefined4)local_98;
  key.proto._reader.pointerCount = local_98._4_2_;
  key.proto._reader._38_2_ = local_98._6_2_;
  key.proto._reader._40_8_ = uStack_90;
  kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::
  upsert<capnp::JsonCodec::addFieldHandlerImpl(capnp::StructSchema::Field,capnp::Type,capnp::JsonCodec::HandlerBase&)::__0>
            ((HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*> *)
             &pIVar2->fieldHandlers,key,(HandlerBase *)_kjCondition._40_8_,&local_c9);
  return;
}

Assistant:

void JsonCodec::addFieldHandlerImpl(StructSchema::Field field, Type type, HandlerBase& handler) {
  KJ_REQUIRE(type == field.getType(),
      "handler type did not match field type for addFieldHandler()");
  impl->fieldHandlers.upsert(field, &handler, [](HandlerBase*& existing, HandlerBase* replacement) {
    KJ_REQUIRE(existing == replacement, "field already has a different registered handler");
  });
}